

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts5HashScanEntry(Fts5Hash *pHash,char **pzTerm,u8 **ppDoclist,int *pnDoclist)

{
  Fts5HashEntry *p;
  size_t sVar1;
  u8 *puVar2;
  int iVar3;
  Fts5HashEntry *__s;
  
  p = pHash->pScan;
  if (p == (Fts5HashEntry *)0x0) {
    __s = (Fts5HashEntry *)0x0;
    puVar2 = (u8 *)0x0;
    iVar3 = 0;
  }
  else {
    __s = p + 1;
    sVar1 = strlen((char *)__s);
    fts5HashAddPoslistSize(pHash,p,(Fts5HashEntry *)0x0);
    puVar2 = (u8 *)((long)&p[1].pHashNext + (long)((int)sVar1 + 1));
    iVar3 = (p->nData - (int)sVar1) + -0x31;
  }
  *pzTerm = (char *)__s;
  *ppDoclist = puVar2;
  *pnDoclist = iVar3;
  return;
}

Assistant:

static void sqlite3Fts5HashScanEntry(
  Fts5Hash *pHash,
  const char **pzTerm,            /* OUT: term (nul-terminated) */
  const u8 **ppDoclist,           /* OUT: pointer to doclist */
  int *pnDoclist                  /* OUT: size of doclist in bytes */
){
  Fts5HashEntry *p;
  if( (p = pHash->pScan) ){
    char *zKey = fts5EntryKey(p);
    int nTerm = (int)strlen(zKey);
    fts5HashAddPoslistSize(pHash, p, 0);
    *pzTerm = zKey;
    *ppDoclist = (const u8*)&zKey[nTerm+1];
    *pnDoclist = p->nData - (sizeof(Fts5HashEntry) + nTerm + 1);
  }else{
    *pzTerm = 0;
    *ppDoclist = 0;
    *pnDoclist = 0;
  }
}